

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::createLoopExit(Builder *this)

{
  reference pvVar1;
  Builder *this_local;
  
  pvVar1 = std::
           stack<spv::Builder::LoopBlocks,_std::deque<spv::Builder::LoopBlocks,_std::allocator<spv::Builder::LoopBlocks>_>_>
           ::top(&this->loops);
  createBranch(this,pvVar1->merge);
  createAndSetNoPredecessorBlock(this,"post-loop-break");
  return;
}

Assistant:

void Builder::createLoopExit()
{
    createBranch(&loops.top().merge);
    // Set up a block for dead code.
    createAndSetNoPredecessorBlock("post-loop-break");
}